

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoSink.cpp
# Opt level: O2

void __thiscall glslang::TInfoSinkBase::append(TInfoSinkBase *this,TPersistString *t)

{
  uint uVar1;
  
  uVar1 = this->outputStream;
  if ((uVar1 & 4) != 0) {
    checkMem(this,t->_M_string_length);
    std::__cxx11::string::append((string *)this);
    uVar1 = this->outputStream;
  }
  if ((uVar1 & 2) == 0) {
    return;
  }
  fputs((t->_M_dataplus)._M_p,_stdout);
  return;
}

Assistant:

void TInfoSinkBase::append(const TPersistString& t)
{
    if (outputStream & EString) {
        checkMem(t.size());
        sink.append(t);
    }

//#ifdef _WIN32
//    if (outputStream & EDebugger)
//        OutputDebugString(t.c_str());
//#endif

    if (outputStream & EStdOut)
        fprintf(stdout, "%s", t.c_str());
}